

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O2

int __thiscall pbrt::NextPrime(pbrt *this,int x)

{
  undefined1 auVar1 [16];
  bool bVar2;
  uint uVar3;
  uint n;
  int iVar4;
  undefined8 in_XMM0_Qa;
  double dVar6;
  undefined1 auVar7 [16];
  initializer_list<int> __l;
  int local_5c;
  double local_58;
  double local_50;
  anon_class_8_1_d89be81b isPrime;
  vector<int,_std::allocator<int>_> smallPrimes;
  int iVar5;
  
  if ((uint)this == 2) {
    n = 3;
  }
  else {
    uVar3 = (uint)this | 1;
    isPrime.smallPrimes._0_4_ = 2;
    __l._M_len = 1;
    __l._M_array = (iterator)&isPrime;
    std::vector<int,_std::allocator<int>_>::vector(&smallPrimes,__l,(allocator_type *)&local_5c);
    auVar7._0_8_ = (double)(int)(uVar3 + 0x140);
    auVar7._8_8_ = in_XMM0_Qa;
    iVar4 = 3;
    auVar1 = vsqrtsd_avx(auVar7,auVar7);
    local_50 = auVar1._0_8_;
    local_58 = auVar7._0_8_;
    isPrime.smallPrimes = &smallPrimes;
    while( true ) {
      dVar6 = local_50;
      local_5c = iVar4;
      if (local_58 < 0.0) {
        dVar6 = sqrt(local_58);
      }
      iVar5 = local_5c;
      if ((int)dVar6 < iVar4) break;
      bVar2 = NextPrime::anon_class_8_1_d89be81b::operator()(&isPrime,local_5c);
      if (bVar2) {
        std::vector<int,_std::allocator<int>_>::push_back
                  (&smallPrimes,(value_type_conflict3 *)&local_5c);
        iVar5 = local_5c;
      }
      iVar4 = iVar5 + 2;
    }
    do {
      n = uVar3;
      bVar2 = NextPrime::anon_class_8_1_d89be81b::operator()(&isPrime,n);
      uVar3 = n + 2;
    } while (!bVar2);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&smallPrimes.super__Vector_base<int,_std::allocator<int>_>);
  }
  return n;
}

Assistant:

int NextPrime(int x) {
    if (x == 2)
        return 3;
    if ((x & 1) == 0)
        ++x;  // make it odd

    std::vector<int> smallPrimes{2};
    // NOTE: isPrime w.r.t. smallPrims...
    auto isPrime = [&smallPrimes](int n) {
        for (int p : smallPrimes)
            if (n != p && (n % p) == 0)
                return false;
        return true;
    };

    // Initialize smallPrimes
    // Up to about 2B, the biggest gap between primes:
    // https://en.wikipedia.org/wiki/Prime_gap
    const int maxPrimeGap = 320;
    for (int n = 3; n < int(std::sqrt(x + maxPrimeGap)) + 1; n += 2)
        if (isPrime(n))
            smallPrimes.push_back(n);

    while (!isPrime(x))
        x += 2;

    return x;
}